

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

uint64_t __thiscall CConnman::CalculateKeyedNetGroup(CConnman *this,CAddress *address)

{
  CSipHasher *this_00;
  uint64_t uVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchNetGroup;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  CSipHasher local_40;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,this->m_netgroupman,
             (CNetAddr *)address);
  GetDeterministicRandomizer(&local_40,this,0x6c0edd8036ef4036);
  data.m_size = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58._M_impl.super__Vector_impl_data._M_start;
  data.m_data = local_58._M_impl.super__Vector_impl_data._M_start;
  this_00 = CSipHasher::Write(&local_40,data);
  uVar1 = CSipHasher::Finalize(this_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t CConnman::CalculateKeyedNetGroup(const CAddress& address) const
{
    std::vector<unsigned char> vchNetGroup(m_netgroupman.GetGroup(address));

    return GetDeterministicRandomizer(RANDOMIZER_ID_NETGROUP).Write(vchNetGroup).Finalize();
}